

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertLine
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,LineGeometry *line,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  pointer *ppuVar1;
  uint uVar2;
  pointer __src;
  pointer piVar3;
  pointer piVar4;
  uint *puVar5;
  iterator __position;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  aiMesh *paVar8;
  aiVector3D *__s;
  ulong *puVar9;
  aiFace *paVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t __n;
  int iVar14;
  ulong uVar15;
  aiFace *paVar16;
  int iVar17;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = LineGeometry::GetVertices(line);
  pvVar7 = LineGeometry::GetIndices(line);
  if (((pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_start ==
       (pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::operator+(&local_1c8,"ignoring empty line: ",&(line->super_Geometry).super_Object.name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &local_1c8);
    LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
  }
  else {
    paVar8 = SetupEmptyMesh(this,&line->super_Geometry,nd);
    *(byte *)&paVar8->mPrimitiveTypes = (byte)paVar8->mPrimitiveTypes | 2;
    uVar15 = ((long)(pvVar6->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar6->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc;
    paVar8->mNumVertices = (uint)uVar15;
    uVar15 = uVar15 & 0xffffffff;
    __s = (aiVector3D *)operator_new__(uVar15 * 0xc);
    if (uVar15 != 0) {
      memset(__s,0,((uVar15 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar8->mVertices = __s;
    __src = (pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__s,__src,__n);
    }
    piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    uVar15 = (long)piVar4 - (long)piVar3 >> 2;
    if (piVar4 == piVar3) {
      iVar17 = 0;
    }
    else {
      uVar13 = 0;
      iVar17 = 0;
      do {
        iVar17 = iVar17 - (piVar3[uVar13] >> 0x1f);
        uVar13 = uVar13 + 1;
      } while ((uVar13 & 0xffffffff) < uVar15);
    }
    iVar14 = (int)uVar15;
    uVar13 = (ulong)(uint)(iVar14 - iVar17);
    paVar8->mNumFaces = iVar14 - iVar17;
    puVar9 = (ulong *)operator_new__(uVar13 * 0x10 + 8);
    *puVar9 = uVar13;
    paVar16 = (aiFace *)(puVar9 + 1);
    if (iVar14 != iVar17) {
      paVar10 = paVar16;
      do {
        paVar10->mNumIndices = 0;
        paVar10->mIndices = (uint *)0x0;
        paVar10 = paVar10 + 1;
      } while (paVar10 != paVar16 + uVar13);
    }
    paVar8->mFaces = paVar16;
    if (iVar14 != 0) {
      uVar13 = 1;
      do {
        if (-1 < (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar13 - 1]) {
          paVar16->mNumIndices = 2;
          puVar11 = (uint *)operator_new__(8);
          paVar16->mIndices = puVar11;
          puVar5 = paVar16->mIndices;
          paVar16 = paVar16 + 1;
          piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar11 = piVar3[uVar13 - 1];
          uVar12 = uVar13;
          if (uVar13 == (uVar15 & 0xffffffff)) {
            uVar12 = 0;
          }
          uVar2 = piVar3[uVar12];
          puVar5[1] = (int)uVar2 >> 0x1f ^ uVar2;
        }
        bVar18 = uVar13 != (uVar15 & 0xffffffff);
        uVar13 = uVar13 + 1;
      } while (bVar18);
    }
    local_1a8._0_4_ =
         (int)((ulong)((long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (__return_storage_ptr__,__position,(uint *)local_1a8);
    }
    else {
      *__position._M_current = local_1a8._0_4_;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertLine(const LineGeometry& line, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            const std::vector<aiVector3D>& vertices = line.GetVertices();
            const std::vector<int>& indices = line.GetIndices();
            if (vertices.empty() || indices.empty()) {
                FBXImporter::LogWarn("ignoring empty line: " + line.Name());
                return temp;
            }

            aiMesh* const out_mesh = SetupEmptyMesh(line, nd);
            out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[out_mesh->mNumVertices];
            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            //Number of line segments (faces) is "Number of Points - Number of Endpoints"
            //N.B.: Endpoints in FbxLine are denoted by negative indices.
            //If such an Index is encountered, add 1 and multiply by -1 to get the real index.
            unsigned int epcount = 0;
            for (unsigned i = 0; i < indices.size(); i++)
            {
                if (indices[i] < 0) {
                    epcount++;
                }
            }
            unsigned int pcount = static_cast<unsigned int>( indices.size() );
            unsigned int scount = out_mesh->mNumFaces = pcount - epcount;

            aiFace* fac = out_mesh->mFaces = new aiFace[scount]();
            for (unsigned int i = 0; i < pcount; ++i) {
                if (indices[i] < 0) continue;
                aiFace& f = *fac++;
                f.mNumIndices = 2; //2 == aiPrimitiveType_LINE 
                f.mIndices = new unsigned int[2];
                f.mIndices[0] = indices[i];
                int segid = indices[(i + 1 == pcount ? 0 : i + 1)];   //If we have reached he last point, wrap around
                f.mIndices[1] = (segid < 0 ? (segid + 1)*-1 : segid); //Convert EndPoint Index to normal Index
            }
            temp.push_back(static_cast<unsigned int>(meshes.size() - 1));
            return temp;
        }